

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pline.c
# Opt level: O0

void impossible(char *s,...)

{
  char local_128 [8];
  char pbuf [256];
  va_list the_args;
  char *s_local;
  
  pbuf[0xfc] = '0';
  pbuf[0xfd] = '\0';
  pbuf[0xfe] = '\0';
  pbuf[0xff] = '\0';
  pbuf[0xf8] = '\b';
  pbuf[0xf9] = '\0';
  pbuf[0xfa] = '\0';
  pbuf[0xfb] = '\0';
  if (program_state.in_impossible != 0) {
    panic("impossible called impossible");
  }
  program_state.in_impossible = 1;
  vsprintf(local_128,s,(__va_list_tag *)(pbuf + 0xf8));
  paniclog("impossible",local_128);
  vpline(s,(__va_list_tag *)(pbuf + 0xf8));
  pline("Program in disorder - perhaps you\'d better save.");
  program_state.in_impossible = 0;
  return;
}

Assistant:

void impossible (const char *s, ...)
{
	va_list the_args;
	va_start(the_args, s);
	if (program_state.in_impossible)
		panic("impossible called impossible");
	program_state.in_impossible = 1;
	{
	    char pbuf[BUFSZ];
	    vsprintf(pbuf,s,the_args);
	    paniclog("impossible", pbuf);
	}
	vpline(s,the_args);
	pline("Program in disorder - perhaps you'd better save.");
	program_state.in_impossible = 0;
	va_end(the_args);
}